

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseTools.h
# Opt level: O2

unique_ptr<std::thread,_std::default_delete<std::thread>_> __thiscall
tonk::MakeUniqueNoThrow<std::thread,void(tonk::gateway::AsioHost::*)(),tonk::gateway::AsioHost*>
          (tonk *this,type *args,AsioHost **args_1)

{
  thread *this_00;
  
  this_00 = (thread *)operator_new(8,(nothrow_t *)&std::nothrow);
  if (this_00 != (thread *)0x0) {
    std::thread::thread<void(tonk::gateway::AsioHost::*)(),tonk::gateway::AsioHost*,void>
              (this_00,args,args_1);
  }
  *(thread **)this = this_00;
  return (__uniq_ptr_data<std::thread,_std::default_delete<std::thread>,_true,_true>)
         (__uniq_ptr_data<std::thread,_std::default_delete<std::thread>,_true,_true>)this;
}

Assistant:

inline std::unique_ptr<T> MakeUniqueNoThrow(Args&&... args) {
    return std::unique_ptr<T>(new(std::nothrow) T(std::forward<Args>(args)...));
}